

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_tree(char *args)

{
  char *__s;
  size_t sVar1;
  uint local_18;
  uint local_14;
  int total_file_count;
  int total_dir_count;
  char *args_local;
  
  local_14 = 0;
  local_18 = 0;
  _total_file_count = args;
  if (*args == '\"') {
    __s = args + 1;
    _total_file_count = __s;
    sVar1 = strlen(__s);
    __s[sVar1 - 1] = '\0';
  }
  cmd_tree_recursive("",_total_file_count,_total_file_count,0,(int *)&local_14,(int *)&local_18);
  printf("\n%d directories, %d files\n",(ulong)local_14,(ulong)local_18);
  return 1;
}

Assistant:

static int cmd_tree(char *args)
{
    int total_dir_count = 0, total_file_count = 0; /* FIXME: should be PHYSFS_uint64 */

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    cmd_tree_recursive("", args, args, 0, &total_dir_count, &total_file_count);

    printf("\n%d directories, %d files\n", total_dir_count, total_file_count);
    return 1;
}